

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int *piVar2;
  void *pvVar3;
  Layer *pLVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  uint _w;
  int iVar17;
  int iVar18;
  _func_int **pp_Var19;
  int iVar20;
  ulong uVar21;
  _func_int *p_Var22;
  Option *_elemsize;
  void *pvVar23;
  int iVar24;
  int iVar25;
  Option *opt_00;
  undefined1 (*pauVar26) [64];
  uint _elempack;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  undefined1 (*pauVar30) [64];
  ulong uVar31;
  int iVar32;
  uint uVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  v4sf one;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 in_ZMM30 [64];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_248;
  ulong local_238;
  ulong local_200;
  Mat local_1f8;
  Mat local_1a8;
  Mat local_158;
  int local_10c;
  void *local_108;
  int *local_100;
  ulong local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  ulong local_c8;
  _func_int ***local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar49 [16];
  
  auVar47 = in_ZMM30._0_16_;
  p_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  if ((opt->use_int8_inference == true) && (*(int *)(&this->field_0x10c + (long)p_Var22) != 0)) {
    iVar15 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar15;
  }
  uVar27 = bottom_blob->c;
  uVar21 = (ulong)uVar27;
  uVar31 = bottom_blob->elemsize;
  iVar15 = bottom_blob->elempack;
  iVar32 = *(int *)(&this->field_0xd4 + (long)p_Var22);
  iVar16 = *(int *)(&this->field_0xdc + (long)p_Var22);
  iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var22);
  iVar18 = *(int *)(&this->field_0xe0 + (long)p_Var22);
  local_1f8.cstep = 0;
  local_1f8.data = (Allocator *)0x0;
  local_1f8.refcount._0_4_ = 0;
  local_1f8.refcount._4_4_ = 0;
  local_1f8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1f8.elempack = 0;
  local_1f8.h = 0;
  local_1f8.allocator = (Allocator *)local_1f8.data;
  local_1f8.dims = (int)local_1f8.refcount;
  local_1f8.w = local_1f8.refcount._4_4_;
  local_1f8.d = (int)local_1f8.refcount;
  local_1f8.c = local_1f8.elempack;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx512 + (long)p_Var22),bottom_blob,
             &local_1f8,opt);
  iVar14 = local_1f8.w;
  iVar17 = -100;
  if (((Allocator *)local_1f8.data == (Allocator *)0x0) ||
     ((long)local_1f8.c * local_1f8.cstep == 0)) goto LAB_00417a02;
  p_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar16 = (~((iVar32 + -1) * iVar16) + local_1f8.w) / *(int *)(&this->field_0xe4 + (long)p_Var22);
  _w = iVar16 + 1;
  iVar32 = (~((iVar20 + -1) * iVar18) + local_1f8.h) / *(int *)(&this->field_0xe8 + (long)p_Var22);
  uVar33 = *(uint *)(&this->field_0xd0 + (long)p_Var22);
  uVar28 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar33 & 0xf) == 0) {
      uVar28 = 0x10;
    }
    else if ((uVar33 & 7) == 0) {
      uVar28 = 8;
    }
    else {
      uVar28 = (ulong)((uint)((uVar33 & 3) == 0) * 3 + 1);
    }
  }
  _elempack = (uint)uVar28;
  _elemsize = (Option *)((uVar31 / (ulong)(long)iVar15) * uVar28);
  opt_00 = _elemsize;
  Mat::create(top_blob,_w,iVar32 + 1,(int)uVar33 / (int)_elempack,(size_t)_elemsize,_elempack,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_00417a02;
  iVar17 = iVar15 * uVar27;
  p_Var22 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar20 = *(int *)(&this->field_0xd0 + (long)p_Var22);
  iVar18 = *(int *)(&this->field_0x108 + (long)p_Var22);
  if ((iVar17 != iVar18) || (iVar17 != iVar20)) goto LAB_00416713;
  iVar20 = iVar17;
  if (7 < iVar15) {
    if (iVar15 == 8) {
      iVar15 = *(int *)(&this->field_0xd4 + (long)p_Var22);
      iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var22);
      if (iVar15 == 5) {
        if (iVar20 == 5) {
          if ((((*(int *)(&this->field_0xdc + (long)p_Var22) == 1) &&
               (*(int *)(&this->field_0xe0 + (long)p_Var22) == 1)) &&
              (*(int *)(&this->field_0xe4 + (long)p_Var22) == 1)) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var22) == 1)) {
            convdw5x5s1_pack8_avx
                      (&local_1f8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
          }
          else {
            iVar20 = 5;
            if (((*(int *)(&this->field_0xdc + (long)p_Var22) != 1) ||
                (*(int *)(&this->field_0xe0 + (long)p_Var22) != 1)) ||
               ((*(int *)(&this->field_0xe4 + (long)p_Var22) != 2 ||
                (*(int *)(&this->field_0xe8 + (long)p_Var22) != 2)))) goto LAB_0041778e;
            convdw5x5s2_pack8_avx
                      (&local_1f8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
          }
          goto LAB_0041776e;
        }
      }
      else if ((iVar15 == 3) && (iVar20 == 3)) {
        if ((*(int *)(&this->field_0xdc + (long)p_Var22) == 1) &&
           (((*(int *)(&this->field_0xe0 + (long)p_Var22) == 1 &&
             (*(int *)(&this->field_0xe4 + (long)p_Var22) == 1)) &&
            (*(int *)(&this->field_0xe8 + (long)p_Var22) == 1)))) {
          convdw3x3s1_pack8_avx
                    (&local_1f8,top_blob,&this->weight_data_tm,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
        }
        else {
          iVar20 = 3;
          if ((((*(int *)(&this->field_0xdc + (long)p_Var22) != 1) ||
               (*(int *)(&this->field_0xe0 + (long)p_Var22) != 1)) ||
              (*(int *)(&this->field_0xe4 + (long)p_Var22) != 2)) ||
             (*(int *)(&this->field_0xe8 + (long)p_Var22) != 2)) goto LAB_0041778e;
          convdw3x3s2_pack8_avx
                    (&local_1f8,top_blob,&this->weight_data_tm,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
        }
        goto LAB_0041776e;
      }
LAB_0041778e:
      uVar33 = iVar20 * iVar15;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar33,
                 (allocator_type *)&local_1a8);
      pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
      p_Var22 = pp_Var19[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var22)) {
        iVar15 = *(int *)(&this->field_0xe0 + (long)p_Var22);
        iVar20 = *(int *)(&this->field_0xdc + (long)p_Var22);
        iVar18 = *(int *)(&this->field_0xd4 + (long)p_Var22);
        iVar17 = 0;
        iVar24 = 0;
        iVar25 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var22)) {
            lVar29 = 0;
            do {
              *(int *)((long)(_func_int ***)local_158.data + lVar29 * 4 + (long)iVar25 * 4) = iVar24
              ;
              p_Var22 = pp_Var19[-3];
              iVar24 = iVar24 + *(int *)(&this->field_0xdc + (long)p_Var22);
              lVar29 = lVar29 + 1;
            } while ((int)lVar29 < *(int *)(&this->field_0xd4 + (long)p_Var22));
            iVar25 = iVar25 + (int)lVar29;
          }
          iVar24 = iVar24 + (iVar14 * iVar15 - iVar20 * iVar18);
          iVar17 = iVar17 + 1;
        } while (iVar17 < *(int *)(&this->field_0xd8 + (long)p_Var22));
      }
      if (0 < (int)uVar27) {
        iVar15 = 0;
        local_248 = 0;
        do {
          if (-1 < iVar32) {
            pvVar23 = (void *)(top_blob->cstep * local_248 * top_blob->elemsize +
                              (long)top_blob->data);
            pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
            pvVar3 = (this->weight_data_tm).data;
            iVar20 = 0;
            do {
              if (-1 < iVar16) {
                uVar31 = 0;
                do {
                  p_Var22 = pp_Var19[-3];
                  if (*(int *)(&this->field_0x100 + (long)p_Var22) == 0) {
                    auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar59 = ZEXT3264(*(undefined1 (*) [32])
                                        (*(long *)(&this->field_0x1b0 + (long)p_Var22) +
                                        local_248 * 0x20));
                  }
                  auVar60 = auVar59._0_32_;
                  if (0 < (int)uVar33) {
                    lVar29 = 0;
                    do {
                      auVar47 = vfmadd231ps_fma(auVar59._0_32_,
                                                *(undefined1 (*) [32])
                                                 ((long)&((Allocator *)
                                                         ((long)local_1f8.data +
                                                         (long)*(int *)((long)(_func_int ***)
                                                                              local_158.data +
                                                                       lVar29) * 4 * 8))->
                                                         _vptr_Allocator +
                                                 (long)(*(int *)(&this->field_0xe4 + (long)p_Var22)
                                                        * (int)uVar31 * 8) * 4 +
                                                 (long)*(int *)(&this->field_0xe8 + (long)p_Var22) *
                                                 (long)iVar20 *
                                                 (long)local_1f8.w * local_1f8.elemsize +
                                                 local_1f8.cstep * local_248 * local_1f8.elemsize),
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar3 + lVar29 * 8 + (long)iVar15 * 4));
                      auVar59 = ZEXT1664(auVar47);
                      auVar60 = ZEXT1632(auVar47);
                      lVar29 = lVar29 + 4;
                    } while ((ulong)uVar33 << 2 != lVar29);
                  }
                  *(undefined1 (*) [32])((long)pvVar23 + uVar31 * 0x20) = auVar60;
                  uVar31 = uVar31 + 1;
                } while (uVar31 != _w);
              }
              pvVar23 = (void *)((long)pvVar23 + (long)(int)(_w * 8) * 4);
              bVar34 = iVar20 != iVar32;
              iVar20 = iVar20 + 1;
            } while (bVar34);
          }
          local_248 = local_248 + 1;
          iVar15 = iVar15 + uVar33 * 8;
        } while (local_248 != uVar21);
      }
      pLVar4 = this->activation;
      if (pLVar4 != (Layer *)0x0) {
        (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
      }
    }
    else {
      if (iVar15 != 0x10) goto LAB_00416713;
      iVar15 = *(int *)(&this->field_0xd4 + (long)p_Var22);
      iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var22);
      if (iVar15 == 5) {
        if (iVar20 == 5) {
          if (((*(int *)(&this->field_0xdc + (long)p_Var22) == 1) &&
              (*(int *)(&this->field_0xe0 + (long)p_Var22) == 1)) &&
             ((*(int *)(&this->field_0xe4 + (long)p_Var22) == 1 &&
              (*(int *)(&this->field_0xe8 + (long)p_Var22) == 1)))) {
            convdw5x5s1_pack16_avx512
                      (&local_1f8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
          }
          else {
            iVar20 = 5;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var22) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var22) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var22) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var22) != 2)) goto LAB_004174f6;
            convdw5x5s2_pack16_avx512
                      (&local_1f8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
          }
          goto LAB_0041776e;
        }
      }
      else if ((iVar15 == 3) && (iVar20 == 3)) {
        if (((*(int *)(&this->field_0xdc + (long)p_Var22) == 1) &&
            ((*(int *)(&this->field_0xe0 + (long)p_Var22) == 1 &&
             (*(int *)(&this->field_0xe4 + (long)p_Var22) == 1)))) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var22) == 1)) {
          convdw3x3s1_pack16_avx512
                    (&local_1f8,top_blob,&this->weight_data_tm,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
        }
        else {
          iVar20 = 3;
          if ((((*(int *)(&this->field_0xdc + (long)p_Var22) != 1) ||
               (*(int *)(&this->field_0xe0 + (long)p_Var22) != 1)) ||
              (*(int *)(&this->field_0xe4 + (long)p_Var22) != 2)) ||
             (*(int *)(&this->field_0xe8 + (long)p_Var22) != 2)) goto LAB_004174f6;
          convdw3x3s2_pack16_avx512
                    (&local_1f8,top_blob,&this->weight_data_tm,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
        }
        goto LAB_0041776e;
      }
LAB_004174f6:
      uVar33 = iVar20 * iVar15;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar33,
                 (allocator_type *)&local_1a8);
      pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
      p_Var22 = pp_Var19[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var22)) {
        iVar15 = *(int *)(&this->field_0xe0 + (long)p_Var22);
        iVar20 = *(int *)(&this->field_0xdc + (long)p_Var22);
        iVar18 = *(int *)(&this->field_0xd4 + (long)p_Var22);
        iVar17 = 0;
        iVar24 = 0;
        iVar25 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var22)) {
            lVar29 = 0;
            do {
              *(int *)((long)(_func_int ***)local_158.data + lVar29 * 4 + (long)iVar17 * 4) = iVar24
              ;
              p_Var22 = pp_Var19[-3];
              iVar24 = iVar24 + *(int *)(&this->field_0xdc + (long)p_Var22);
              lVar29 = lVar29 + 1;
            } while ((int)lVar29 < *(int *)(&this->field_0xd4 + (long)p_Var22));
            iVar17 = iVar17 + (int)lVar29;
          }
          iVar24 = iVar24 + (iVar14 * iVar15 - iVar20 * iVar18);
          iVar25 = iVar25 + 1;
        } while (iVar25 < *(int *)(&this->field_0xd8 + (long)p_Var22));
      }
      if (0 < (int)uVar27) {
        iVar15 = 0;
        local_238 = 0;
        do {
          if (-1 < iVar32) {
            pauVar30 = (undefined1 (*) [64])
                       (top_blob->cstep * local_238 * top_blob->elemsize + (long)top_blob->data);
            pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
            pvVar23 = (this->weight_data_tm).data;
            iVar20 = 0;
            do {
              if (-1 < iVar16) {
                iVar18 = 0;
                do {
                  p_Var22 = pp_Var19[-3];
                  if (*(int *)(&this->field_0x100 + (long)p_Var22) == 0) {
                    auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar59 = *(undefined1 (*) [64])
                               (*(long *)(&this->field_0x1b0 + (long)p_Var22) + local_238 * 0x40);
                  }
                  if (0 < (int)uVar33) {
                    uVar31 = 0;
                    pauVar26 = (undefined1 (*) [64])((long)iVar15 * 4 + (long)pvVar23);
                    do {
                      auVar59 = vfmadd231ps_avx512f(auVar59,*(undefined1 (*) [64])
                                                             ((long)&((Allocator *)
                                                                     ((long)local_1f8.data +
                                                                     (long)*(int *)((long)(_func_int
                                                                                           ***)
                                                  local_158.data + uVar31 * 4) * 8 * 8))->
                                                  _vptr_Allocator +
                                                  (long)(*(int *)(&this->field_0xe4 + (long)p_Var22)
                                                         * iVar18 * 0x10) * 4 +
                                                  (long)*(int *)(&this->field_0xe8 + (long)p_Var22)
                                                  * (long)iVar20 *
                                                  (long)local_1f8.w * local_1f8.elemsize +
                                                  local_1f8.cstep * local_238 * local_1f8.elemsize),
                                                  *pauVar26);
                      uVar31 = uVar31 + 1;
                      pauVar26 = pauVar26 + 1;
                    } while (uVar33 != uVar31);
                  }
                  *pauVar30 = auVar59;
                  pauVar30 = pauVar30 + 1;
                  bVar34 = iVar18 != iVar16;
                  iVar18 = iVar18 + 1;
                } while (bVar34);
              }
              bVar34 = iVar20 != iVar32;
              iVar20 = iVar20 + 1;
            } while (bVar34);
          }
          local_238 = local_238 + 1;
          iVar15 = iVar15 + uVar33 * 0x10;
        } while (local_238 != uVar21);
      }
      pLVar4 = this->activation;
      if (pLVar4 != (Layer *)0x0) {
        (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
      }
    }
LAB_004179e7:
    if ((Allocator *)local_158.data != (Allocator *)0x0) {
      operator_delete(local_158.data,local_158.elemsize - (long)local_158.data);
    }
LAB_004179ff:
    iVar17 = 0;
    goto LAB_00417a02;
  }
  if (iVar15 == 1) {
    if ((*(int *)(&this->field_0xd4 + (long)p_Var22) == 3) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var22) == 3)) {
      if ((*(int *)(&this->field_0xdc + (long)p_Var22) == 1) &&
         (((*(int *)(&this->field_0xe0 + (long)p_Var22) == 1 &&
           (*(int *)(&this->field_0xe4 + (long)p_Var22) == 1)) &&
          (*(int *)(&this->field_0xe8 + (long)p_Var22) == 1)))) {
        convdw3x3s1_sse(&local_1f8,top_blob,(Mat *)(this->weight_data_tm).data,
                        *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
      }
      else {
        if (((*(int *)(&this->field_0xdc + (long)p_Var22) != 1) ||
            (*(int *)(&this->field_0xe0 + (long)p_Var22) != 1)) ||
           ((*(int *)(&this->field_0xe4 + (long)p_Var22) != 2 ||
            (*(int *)(&this->field_0xe8 + (long)p_Var22) != 2)))) goto LAB_00416713;
        convdw3x3s2_sse(&local_1f8,top_blob,(Mat *)(this->weight_data_tm).data,
                        *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
      }
LAB_0041776e:
      pLVar4 = this->activation;
      if (pLVar4 != (Layer *)0x0) {
        (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
      }
      goto LAB_004179ff;
    }
  }
  else if (iVar15 == 4) {
    iVar15 = *(int *)(&this->field_0xd4 + (long)p_Var22);
    iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var22);
    if (iVar15 == 5) {
      if (iVar20 == 5) {
        if (((*(int *)(&this->field_0xdc + (long)p_Var22) == 1) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var22) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var22) == 1 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var22) == 1)))) {
          convdw5x5s1_pack4_sse
                    (&local_1f8,top_blob,&this->weight_data_tm,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
        }
        else {
          iVar20 = 5;
          if (((*(int *)(&this->field_0xdc + (long)p_Var22) != 1) ||
              (*(int *)(&this->field_0xe0 + (long)p_Var22) != 1)) ||
             ((*(int *)(&this->field_0xe4 + (long)p_Var22) != 2 ||
              (*(int *)(&this->field_0xe8 + (long)p_Var22) != 2)))) goto LAB_00416e78;
          convdw5x5s2_pack4_sse
                    (&local_1f8,top_blob,&this->weight_data_tm,
                     *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
        }
        goto LAB_0041776e;
      }
    }
    else if ((iVar15 == 3) && (iVar20 == 3)) {
      if ((*(int *)(&this->field_0xdc + (long)p_Var22) == 1) &&
         (((*(int *)(&this->field_0xe0 + (long)p_Var22) == 1 &&
           (*(int *)(&this->field_0xe4 + (long)p_Var22) == 1)) &&
          (*(int *)(&this->field_0xe8 + (long)p_Var22) == 1)))) {
        convdw3x3s1_pack4_sse
                  (&local_1f8,top_blob,&this->weight_data_tm,
                   *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
      }
      else {
        iVar20 = 3;
        if ((((*(int *)(&this->field_0xdc + (long)p_Var22) != 1) ||
             (*(int *)(&this->field_0xe0 + (long)p_Var22) != 1)) ||
            (*(int *)(&this->field_0xe4 + (long)p_Var22) != 2)) ||
           (*(int *)(&this->field_0xe8 + (long)p_Var22) != 2)) goto LAB_00416e78;
        convdw3x3s2_pack4_sse
                  (&local_1f8,top_blob,&this->weight_data_tm,
                   *(Mat **)(&this->field_0x1b0 + (long)p_Var22),opt_00);
      }
      goto LAB_0041776e;
    }
LAB_00416e78:
    uVar33 = iVar20 * iVar15;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar33,
               (allocator_type *)&local_1a8);
    pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
    p_Var22 = pp_Var19[-3];
    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var22)) {
      iVar15 = *(int *)(&this->field_0xe0 + (long)p_Var22);
      iVar20 = *(int *)(&this->field_0xdc + (long)p_Var22);
      iVar18 = *(int *)(&this->field_0xd4 + (long)p_Var22);
      iVar17 = 0;
      iVar24 = 0;
      iVar25 = 0;
      do {
        if (0 < *(int *)(&this->field_0xd4 + (long)p_Var22)) {
          lVar29 = 0;
          do {
            *(int *)((long)(_func_int ***)local_158.data + lVar29 * 4 + (long)iVar25 * 4) = iVar24;
            p_Var22 = pp_Var19[-3];
            iVar24 = iVar24 + *(int *)(&this->field_0xdc + (long)p_Var22);
            lVar29 = lVar29 + 1;
          } while ((int)lVar29 < *(int *)(&this->field_0xd4 + (long)p_Var22));
          iVar25 = iVar25 + (int)lVar29;
        }
        iVar24 = iVar24 + (iVar14 * iVar15 - iVar20 * iVar18);
        iVar17 = iVar17 + 1;
      } while (iVar17 < *(int *)(&this->field_0xd8 + (long)p_Var22));
    }
    if (0 < (int)uVar27) {
      local_10c = uVar33 * 4;
      iVar15 = 0;
      auVar61._8_4_ = 0x42b0c0a5;
      auVar61._0_8_ = 0x42b0c0a542b0c0a5;
      auVar61._12_4_ = 0x42b0c0a5;
      auVar62._8_4_ = 0xc2b0c0a5;
      auVar62._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar62._12_4_ = 0xc2b0c0a5;
      auVar63._8_4_ = 0x3f000000;
      auVar63._0_8_ = 0x3f0000003f000000;
      auVar63._12_4_ = 0x3f000000;
      auVar64._8_4_ = 0x3fb8aa3b;
      auVar64._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar64._12_4_ = 0x3fb8aa3b;
      auVar65._8_4_ = 0x3f800000;
      auVar65._0_8_ = 0x3f8000003f800000;
      auVar65._12_4_ = 0x3f800000;
      auVar66._8_4_ = 0x3f318000;
      auVar66._0_8_ = 0x3f3180003f318000;
      auVar66._12_4_ = 0x3f318000;
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar74._8_4_ = 0x3ab743ce;
      auVar74._0_8_ = 0x3ab743ce3ab743ce;
      auVar74._12_4_ = 0x3ab743ce;
      auVar75._8_4_ = 0x3c088908;
      auVar75._0_8_ = 0x3c0889083c088908;
      auVar75._12_4_ = 0x3c088908;
      auVar76._8_4_ = 0x3d2aa9c1;
      auVar76._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar76._12_4_ = 0x3d2aa9c1;
      auVar77._8_4_ = 0x3e2aaaaa;
      auVar77._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar77._12_4_ = 0x3e2aaaaa;
      auVar78._8_4_ = 0x3f800000;
      auVar78._0_8_ = 0x3f8000003f800000;
      auVar78._12_4_ = 0x3f800000;
      auVar79._8_4_ = 0xb95e8083;
      auVar79._0_8_ = 0xb95e8083b95e8083;
      auVar79._12_4_ = 0xb95e8083;
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar47 = vxorps_avx512vl(auVar47,auVar47);
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      local_200 = 0;
      do {
        if (-1 < iVar32) {
          pvVar23 = (void *)(top_blob->cstep * local_200 * top_blob->elemsize + (long)top_blob->data
                            );
          pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
          pvVar3 = (this->weight_data_tm).data;
          iVar20 = 0;
          do {
            if (-1 < iVar16) {
              uVar31 = 0;
              do {
                p_Var22 = pp_Var19[-3];
                if (*(int *)(&this->field_0x100 + (long)p_Var22) == 0) {
                  auVar56 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar56 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0x1b0 + (long)p_Var22) + local_200 * 0x10);
                }
                if (0 < (int)uVar33) {
                  lVar29 = 0;
                  do {
                    auVar56 = vfmadd231ps_fma(auVar56,*(undefined1 (*) [16])
                                                       ((long)pvVar3 + lVar29 * 4 + (long)iVar15 * 4
                                                       ),
                                              *(undefined1 (*) [16])
                                               ((long)&((Allocator *)
                                                       ((long)local_1f8.data +
                                                       (long)*(int *)((long)(_func_int ***)
                                                                            local_158.data + lVar29)
                                                       * 2 * 8))->_vptr_Allocator +
                                               (long)(*(int *)(&this->field_0xe4 + (long)p_Var22) *
                                                      (int)uVar31 * 4) * 4 +
                                               (long)*(int *)(&this->field_0xe8 + (long)p_Var22) *
                                               (long)iVar20 * (long)local_1f8.w * local_1f8.elemsize
                                               + local_1f8.cstep * local_200 * local_1f8.elemsize));
                    lVar29 = lVar29 + 4;
                  } while ((ulong)uVar33 << 2 != lVar29);
                }
                switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var22)) {
                case 1:
                  auVar56 = vmaxps_avx512vl(auVar56,auVar47);
                  break;
                case 2:
                  auVar58 = vmaxps_avx512vl(auVar56,auVar47);
                  auVar56 = vminps_avx512vl(auVar56,auVar47);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var22);
                  auVar13._4_4_ = uVar1;
                  auVar13._0_4_ = uVar1;
                  auVar13._8_4_ = uVar1;
                  auVar13._12_4_ = uVar1;
                  auVar56 = vfmadd132ps_avx512vl(auVar56,auVar58,auVar13);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var22);
                  auVar11._4_4_ = uVar1;
                  auVar11._0_4_ = uVar1;
                  auVar11._8_4_ = uVar1;
                  auVar11._12_4_ = uVar1;
                  auVar56 = vmaxps_avx512vl(auVar56,auVar11);
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var22))[1];
                  auVar12._4_4_ = uVar1;
                  auVar12._0_4_ = uVar1;
                  auVar12._8_4_ = uVar1;
                  auVar12._12_4_ = uVar1;
                  auVar56 = vminps_avx512vl(auVar56,auVar12);
                  break;
                case 4:
                  auVar9._8_4_ = 0x80000000;
                  auVar9._0_8_ = 0x8000000080000000;
                  auVar9._12_4_ = 0x80000000;
                  auVar56 = vxorps_avx512vl(auVar56,auVar9);
                  auVar56 = vminps_avx(auVar56,auVar61);
                  auVar58 = vmaxps_avx(auVar56,auVar62);
                  auVar51 = vfmadd231ps_fma(auVar63,auVar58,auVar64);
                  auVar84._0_4_ = (int)auVar51._0_4_;
                  auVar84._4_4_ = (int)auVar51._4_4_;
                  auVar84._8_4_ = (int)auVar51._8_4_;
                  auVar84._12_4_ = (int)auVar51._12_4_;
                  auVar56 = vcvtdq2ps_avx(auVar84);
                  uVar28 = vcmpps_avx512vl(auVar51,auVar56,1);
                  auVar51 = vsubps_avx512vl(auVar56,auVar65);
                  bVar34 = (bool)((byte)uVar28 & 1);
                  auVar57._0_4_ =
                       (float)((uint)bVar34 * auVar51._0_4_ | (uint)!bVar34 * auVar56._0_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 1) & 1);
                  auVar57._4_4_ =
                       (float)((uint)bVar34 * auVar51._4_4_ | (uint)!bVar34 * auVar56._4_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 2) & 1);
                  auVar57._8_4_ =
                       (float)((uint)bVar34 * auVar51._8_4_ | (uint)!bVar34 * auVar56._8_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 3) & 1);
                  auVar57._12_4_ =
                       (float)((uint)bVar34 * auVar51._12_4_ | (uint)!bVar34 * auVar56._12_4_);
                  auVar56 = vfmsub231ps_fma(auVar58,auVar57,auVar66);
                  auVar10._8_4_ = 0x395e8083;
                  auVar10._0_8_ = 0x395e8083395e8083;
                  auVar10._12_4_ = 0x395e8083;
                  auVar58 = vfmsub231ps_avx512vl(auVar56,auVar57,auVar10);
                  auVar68._0_4_ = auVar58._0_4_ * auVar58._0_4_;
                  auVar68._4_4_ = auVar58._4_4_ * auVar58._4_4_;
                  auVar68._8_4_ = auVar58._8_4_ * auVar58._8_4_;
                  auVar68._12_4_ = auVar58._12_4_ * auVar58._12_4_;
                  auVar56 = vfmadd213ps_fma(auVar35,auVar58,auVar74);
                  auVar56 = vfmadd213ps_fma(auVar56,auVar58,auVar75);
                  auVar56 = vfmadd213ps_fma(auVar56,auVar58,auVar76);
                  auVar56 = vfmadd213ps_fma(auVar56,auVar58,auVar77);
                  auVar56 = vfmadd213ps_fma(auVar56,auVar58,auVar63);
                  auVar56 = vfmadd213ps_fma(auVar56,auVar68,auVar58);
                  auVar69._0_4_ = auVar56._0_4_ + 1.0;
                  auVar69._4_4_ = auVar56._4_4_ + 1.0;
                  auVar69._8_4_ = auVar56._8_4_ + 1.0;
                  auVar69._12_4_ = auVar56._12_4_ + 1.0;
                  auVar56._0_4_ = (int)auVar57._0_4_;
                  auVar56._4_4_ = (int)auVar57._4_4_;
                  auVar56._8_4_ = (int)auVar57._8_4_;
                  auVar56._12_4_ = (int)auVar57._12_4_;
                  auVar56 = vpslld_avx(auVar56,0x17);
                  auVar56 = vpaddd_avx(auVar78,auVar56);
                  auVar58 = vfmadd213ps_fma(auVar56,auVar69,auVar65);
                  auVar56 = vrcpps_avx(auVar58);
                  auVar58 = vfmsub213ps_fma(auVar58,auVar56,auVar65);
                  auVar56 = vfnmadd132ps_fma(auVar58,auVar56,auVar56);
                  break;
                case 5:
                  auVar58 = vminps_avx(auVar56,auVar61);
                  auVar51 = vmaxps_avx(auVar58,auVar62);
                  auVar49 = vfmadd213ps_fma(auVar64,auVar51,auVar63);
                  auVar80._0_4_ = (int)auVar49._0_4_;
                  auVar80._4_4_ = (int)auVar49._4_4_;
                  auVar80._8_4_ = (int)auVar49._8_4_;
                  auVar80._12_4_ = (int)auVar49._12_4_;
                  auVar58 = vcvtdq2ps_avx(auVar80);
                  uVar28 = vcmpps_avx512vl(auVar49,auVar58,1);
                  auVar49 = vsubps_avx512vl(auVar58,auVar65);
                  bVar34 = (bool)((byte)uVar28 & 1);
                  auVar50._0_4_ =
                       (float)((uint)bVar34 * auVar49._0_4_ | (uint)!bVar34 * auVar58._0_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 1) & 1);
                  auVar50._4_4_ =
                       (float)((uint)bVar34 * auVar49._4_4_ | (uint)!bVar34 * auVar58._4_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 2) & 1);
                  auVar50._8_4_ =
                       (float)((uint)bVar34 * auVar49._8_4_ | (uint)!bVar34 * auVar58._8_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 3) & 1);
                  auVar50._12_4_ =
                       (float)((uint)bVar34 * auVar49._12_4_ | (uint)!bVar34 * auVar58._12_4_);
                  auVar58 = vfmsub231ps_fma(auVar51,auVar50,auVar66);
                  auVar58 = vfnmsub231ps_fma(auVar58,auVar50,auVar79);
                  auVar70._0_4_ = auVar58._0_4_ * auVar58._0_4_;
                  auVar70._4_4_ = auVar58._4_4_ * auVar58._4_4_;
                  auVar70._8_4_ = auVar58._8_4_ * auVar58._8_4_;
                  auVar70._12_4_ = auVar58._12_4_ * auVar58._12_4_;
                  auVar51 = vfmadd213ps_avx512vl(auVar35,auVar58,auVar74);
                  auVar51 = vfmadd213ps_avx512vl(auVar51,auVar58,auVar75);
                  auVar51 = vfmadd213ps_avx512vl(auVar51,auVar58,auVar76);
                  auVar51 = vfmadd213ps_avx512vl(auVar51,auVar58,auVar77);
                  auVar51 = vfmadd213ps_avx512vl(auVar51,auVar58,auVar63);
                  auVar58 = vfmadd213ps_avx512vl(auVar51,auVar70,auVar58);
                  auVar51 = vaddps_avx512vl(auVar58,auVar65);
                  auVar71._0_4_ = (int)auVar50._0_4_;
                  auVar71._4_4_ = (int)auVar50._4_4_;
                  auVar71._8_4_ = (int)auVar50._8_4_;
                  auVar71._12_4_ = (int)auVar50._12_4_;
                  auVar58 = vpslld_avx(auVar71,0x17);
                  auVar58 = vpaddd_avx(auVar58,auVar78);
                  auVar58 = vfmadd213ps_fma(auVar58,auVar51,auVar65);
                  uVar28 = vcmpps_avx512vl(auVar58,auVar47,2);
                  auVar6._8_4_ = 0x800000;
                  auVar6._0_8_ = 0x80000000800000;
                  auVar6._12_4_ = 0x800000;
                  auVar58 = vmaxps_avx512vl(auVar58,auVar6);
                  auVar49 = vpsrld_avx(auVar58,0x17);
                  auVar81._8_4_ = 0x807fffff;
                  auVar81._0_8_ = 0x807fffff807fffff;
                  auVar81._12_4_ = 0x807fffff;
                  auVar7._8_4_ = 0x3f000000;
                  auVar7._0_8_ = 0x3f0000003f000000;
                  auVar7._12_4_ = 0x3f000000;
                  auVar58 = vpternlogd_avx512vl(auVar58,auVar81,auVar7,0xea);
                  uVar5 = vcmpps_avx512vl(auVar58,auVar36,1);
                  auVar51 = vaddps_avx512vl(auVar58,auVar37);
                  auVar58 = vaddps_avx512vl(auVar51,auVar58);
                  bVar34 = (bool)((byte)uVar5 & 1);
                  auVar52._0_4_ =
                       (float)((uint)bVar34 * auVar58._0_4_ | (uint)!bVar34 * auVar51._0_4_);
                  bVar34 = (bool)((byte)(uVar5 >> 1) & 1);
                  auVar52._4_4_ =
                       (float)((uint)bVar34 * auVar58._4_4_ | (uint)!bVar34 * auVar51._4_4_);
                  bVar34 = (bool)((byte)(uVar5 >> 2) & 1);
                  auVar52._8_4_ =
                       (float)((uint)bVar34 * auVar58._8_4_ | (uint)!bVar34 * auVar51._8_4_);
                  bVar34 = (bool)((byte)(uVar5 >> 3) & 1);
                  auVar52._12_4_ =
                       (float)((uint)bVar34 * auVar58._12_4_ | (uint)!bVar34 * auVar51._12_4_);
                  auVar67._0_4_ = auVar52._0_4_ * auVar52._0_4_;
                  auVar67._4_4_ = auVar52._4_4_ * auVar52._4_4_;
                  auVar67._8_4_ = auVar52._8_4_ * auVar52._8_4_;
                  auVar67._12_4_ = auVar52._12_4_ * auVar52._12_4_;
                  auVar58 = vfmadd213ps_avx512vl(auVar38,auVar52,auVar39);
                  auVar58 = vfmadd213ps_avx512vl(auVar58,auVar52,auVar40);
                  auVar58 = vfmadd213ps_avx512vl(auVar58,auVar52,auVar41);
                  auVar58 = vfmadd213ps_avx512vl(auVar58,auVar52,auVar42);
                  auVar58 = vfmadd213ps_avx512vl(auVar58,auVar52,auVar43);
                  auVar58 = vfmadd213ps_avx512vl(auVar58,auVar52,auVar44);
                  auVar58 = vfmadd213ps_avx512vl(auVar58,auVar52,auVar45);
                  auVar58 = vfmadd213ps_avx512vl(auVar58,auVar52,auVar46);
                  auVar51 = vmulps_avx512vl(auVar67,auVar52);
                  auVar51 = vmulps_avx512vl(auVar51,auVar58);
                  auVar8._8_4_ = 0xffffff82;
                  auVar8._0_8_ = 0xffffff82ffffff82;
                  auVar8._12_4_ = 0xffffff82;
                  auVar58 = vpaddd_avx512vl(auVar49,auVar8);
                  auVar58 = vcvtdq2ps_avx(auVar58);
                  auVar49 = vsubps_avx512vl(auVar58,auVar65);
                  bVar34 = (bool)((byte)uVar5 & 1);
                  auVar53._0_4_ = (uint)bVar34 * auVar49._0_4_ | (uint)!bVar34 * auVar58._0_4_;
                  bVar34 = (bool)((byte)(uVar5 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar34 * auVar49._4_4_ | (uint)!bVar34 * auVar58._4_4_;
                  bVar34 = (bool)((byte)(uVar5 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar34 * auVar49._8_4_ | (uint)!bVar34 * auVar58._8_4_;
                  bVar34 = (bool)((byte)(uVar5 >> 3) & 1);
                  auVar53._12_4_ = (uint)bVar34 * auVar49._12_4_ | (uint)!bVar34 * auVar58._12_4_;
                  auVar58 = vfmadd231ps_avx512vl(auVar51,auVar53,auVar79);
                  auVar58 = vfmsub231ps_avx512vl(auVar58,auVar63,auVar67);
                  auVar58 = vsubps_avx512vl(auVar58,auVar52);
                  auVar58 = vfnmadd231ps_fma(auVar58,auVar66,auVar53);
                  auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar34 = (bool)((byte)uVar28 & 1);
                  auVar54._0_4_ =
                       (uint)bVar34 * auVar51._0_4_ |
                       (uint)!bVar34 * (int)(auVar58._0_4_ + auVar58._0_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 1) & 1);
                  auVar54._4_4_ =
                       (uint)bVar34 * auVar51._4_4_ |
                       (uint)!bVar34 * (int)(auVar58._4_4_ + auVar58._4_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 2) & 1);
                  auVar54._8_4_ =
                       (uint)bVar34 * auVar51._8_4_ |
                       (uint)!bVar34 * (int)(auVar58._8_4_ + auVar58._8_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 3) & 1);
                  auVar54._12_4_ =
                       (uint)bVar34 * auVar51._12_4_ |
                       (uint)!bVar34 * (int)(auVar58._12_4_ + auVar58._12_4_);
                  auVar58 = vminps_avx(auVar54,auVar61);
                  auVar51 = vmaxps_avx(auVar58,auVar62);
                  auVar49 = vfmadd213ps_fma(auVar64,auVar51,auVar63);
                  auVar82._0_4_ = (int)auVar49._0_4_;
                  auVar82._4_4_ = (int)auVar49._4_4_;
                  auVar82._8_4_ = (int)auVar49._8_4_;
                  auVar82._12_4_ = (int)auVar49._12_4_;
                  auVar58 = vcvtdq2ps_avx(auVar82);
                  uVar28 = vcmpps_avx512vl(auVar49,auVar58,1);
                  auVar49 = vsubps_avx512vl(auVar58,auVar65);
                  bVar34 = (bool)((byte)uVar28 & 1);
                  auVar55._0_4_ =
                       (float)((uint)bVar34 * auVar49._0_4_ | (uint)!bVar34 * auVar58._0_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 1) & 1);
                  auVar55._4_4_ =
                       (float)((uint)bVar34 * auVar49._4_4_ | (uint)!bVar34 * auVar58._4_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 2) & 1);
                  auVar55._8_4_ =
                       (float)((uint)bVar34 * auVar49._8_4_ | (uint)!bVar34 * auVar58._8_4_);
                  bVar34 = (bool)((byte)(uVar28 >> 3) & 1);
                  auVar55._12_4_ =
                       (float)((uint)bVar34 * auVar49._12_4_ | (uint)!bVar34 * auVar58._12_4_);
                  auVar58 = vfmsub231ps_fma(auVar51,auVar55,auVar66);
                  auVar58 = vfnmsub231ps_fma(auVar58,auVar55,auVar79);
                  auVar72._0_4_ = auVar58._0_4_ * auVar58._0_4_;
                  auVar72._4_4_ = auVar58._4_4_ * auVar58._4_4_;
                  auVar72._8_4_ = auVar58._8_4_ * auVar58._8_4_;
                  auVar72._12_4_ = auVar58._12_4_ * auVar58._12_4_;
                  auVar51 = vfmadd213ps_avx512vl(auVar35,auVar58,auVar74);
                  auVar51 = vfmadd213ps_avx512vl(auVar51,auVar58,auVar75);
                  auVar51 = vfmadd213ps_avx512vl(auVar51,auVar58,auVar76);
                  auVar51 = vfmadd213ps_avx512vl(auVar51,auVar58,auVar77);
                  auVar51 = vfmadd213ps_avx512vl(auVar51,auVar58,auVar63);
                  auVar58 = vfmadd213ps_avx512vl(auVar51,auVar72,auVar58);
                  auVar51 = vaddps_avx512vl(auVar58,auVar65);
                  auVar73._0_4_ = (int)auVar55._0_4_;
                  auVar73._4_4_ = (int)auVar55._4_4_;
                  auVar73._8_4_ = (int)auVar55._8_4_;
                  auVar73._12_4_ = (int)auVar55._12_4_;
                  auVar58 = vpslld_avx(auVar73,0x17);
                  auVar58 = vpaddd_avx(auVar58,auVar78);
                  auVar51 = vfmadd213ps_fma(auVar58,auVar51,auVar65);
                  auVar58 = vrcpps_avx(auVar51);
                  auVar83._0_4_ = auVar58._0_4_ + auVar58._0_4_;
                  auVar83._4_4_ = auVar58._4_4_ + auVar58._4_4_;
                  auVar83._8_4_ = auVar58._8_4_ + auVar58._8_4_;
                  auVar83._12_4_ = auVar58._12_4_ + auVar58._12_4_;
                  auVar51 = vfmsub213ps_avx512vl(auVar51,auVar83,auVar48);
                  auVar58 = vfnmadd213ps_fma(auVar51,auVar58,auVar83);
                  auVar56 = vfmsub231ps_fma(auVar56,auVar56,auVar58);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var22);
                  auVar49._4_4_ = uVar1;
                  auVar49._0_4_ = uVar1;
                  auVar49._8_4_ = uVar1;
                  auVar49._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var22))[1];
                  auVar58._4_4_ = uVar1;
                  auVar58._0_4_ = uVar1;
                  auVar58._8_4_ = uVar1;
                  auVar58._12_4_ = uVar1;
                  auVar58 = vfmadd213ps_avx512vl(auVar49,auVar56,auVar58);
                  auVar58 = vmaxps_avx512vl(auVar58,auVar47);
                  auVar58 = vminps_avx(auVar58,auVar65);
                  auVar51._0_4_ = auVar58._0_4_ * auVar56._0_4_;
                  auVar51._4_4_ = auVar58._4_4_ * auVar56._4_4_;
                  auVar51._8_4_ = auVar58._8_4_ * auVar56._8_4_;
                  auVar51._12_4_ = auVar58._12_4_ * auVar56._12_4_;
                  auVar56 = auVar51;
                }
                *(undefined1 (*) [16])((long)pvVar23 + uVar31 * 0x10) = auVar56;
                uVar31 = uVar31 + 1;
              } while (uVar31 != _w);
            }
            pvVar23 = (void *)((long)pvVar23 + (long)(int)(_w * 4) * 4);
            bVar34 = iVar20 != iVar32;
            iVar20 = iVar20 + 1;
          } while (bVar34);
        }
        local_200 = local_200 + 1;
        iVar15 = iVar15 + local_10c;
      } while (local_200 != uVar21);
    }
    goto LAB_004179e7;
  }
LAB_00416713:
  uVar31 = (long)iVar17 / (long)iVar18;
  uVar21 = (long)iVar20 / (long)iVar18;
  iVar16 = 1;
  uVar27 = 1;
  if (opt->use_packing_layout == true) {
    uVar27 = 0x10;
    iVar16 = 0x10;
    if ((uVar31 & 0xf) != 0) {
      if ((uVar31 & 7) == 0) {
        iVar16 = 8;
      }
      else {
        iVar16 = (uint)((uVar31 & 3) == 0) * 3 + 1;
      }
    }
    if ((uVar21 & 0xf) != 0) {
      if ((uVar21 & 7) == 0) {
        uVar27 = 8;
      }
      else {
        uVar27 = (uint)((uVar21 & 3) == 0) * 3 + 1;
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
  local_158.refcount = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
  local_158.data = local_1f8.data;
  local_158.elemsize = local_1f8.elemsize;
  local_158.elempack = local_1f8.elempack;
  local_158.allocator = local_1f8.allocator;
  local_158.w = local_1f8.w;
  local_158.dims = local_1f8.dims;
  local_158.d = local_1f8.d;
  local_158.h = local_1f8.h;
  local_158.c = local_1f8.c;
  local_158.cstep = local_1f8.cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  if (iVar16 < iVar15) {
    local_1a8.data = *(void **)opt;
    local_1a8.elemsize = (size_t)opt->workspace_allocator;
    local_1a8.elempack = opt->openmp_blocktime;
    local_1a8._28_1_ = opt->use_winograd_convolution;
    local_1a8._29_1_ = opt->use_sgemm_convolution;
    local_1a8._30_1_ = opt->use_int8_inference;
    local_1a8._31_1_ = opt->use_vulkan_compute;
    local_1a8.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_1a8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_1a8._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_1a8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
    local_1a8.refcount = (int *)opt->workspace_allocator;
    convert_packing(&local_1f8,&local_158,iVar16,(Option *)&local_1a8);
  }
  piVar2 = top_blob->refcount;
  local_1a8.data = top_blob->data;
  local_1a8.refcount = top_blob->refcount;
  local_1a8.elemsize = top_blob->elemsize;
  local_1a8.elempack = top_blob->elempack;
  local_1a8.allocator = top_blob->allocator;
  local_1a8.dims = top_blob->dims;
  local_1a8.w = top_blob->w;
  local_1a8.h = top_blob->h;
  local_1a8.d = top_blob->d;
  local_1a8.c = top_blob->c;
  local_1a8.cstep = top_blob->cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
  if (uVar27 < _elempack) {
    Mat::create(&local_1a8,_w,iVar32 + 1,
                *(int *)(&this->field_0xd0 + (long)pp_Var19[-3]) / (int)uVar27,
                (ulong)uVar27 * ((ulong)_elemsize / uVar28),uVar27,opt->workspace_allocator);
    iVar17 = -100;
    if ((local_1a8.data != (void *)0x0) && ((long)local_1a8.c * local_1a8.cstep != 0)) {
      pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
      goto LAB_00416950;
    }
  }
  else {
LAB_00416950:
    if (0 < *(int *)(&this->field_0x108 + (long)pp_Var19[-3])) {
      iVar32 = 0;
      iVar15 = 0;
      lVar29 = 0;
      do {
        local_c0 = (_func_int ***)
                   ((long)(_func_int ***)local_158.data +
                   (long)(iVar32 / iVar16) * local_158.cstep * local_158.elemsize);
        local_b8 = (int *)0x0;
        local_b0 = local_158.elemsize;
        local_a8 = local_158.elempack;
        local_a0 = local_158.allocator;
        local_80 = ((long)local_158.d * local_158.elemsize * (long)local_158.h * (long)local_158.w +
                    0xf & 0xfffffffffffffff0) / local_158.elemsize;
        local_98 = local_158.dims;
        iStack_94 = local_158.w;
        iStack_90 = local_158.h;
        iStack_8c = local_158.d;
        local_108 = (void *)((long)(iVar15 / (int)uVar27) * local_1a8.cstep * local_1a8.elemsize +
                            (long)local_1a8.data);
        local_100 = (int *)0x0;
        local_f8 = local_1a8.elemsize;
        local_f0 = local_1a8.elempack;
        local_e8 = local_1a8.allocator;
        local_c8 = ((long)local_1a8.d * local_1a8.elemsize * (long)local_1a8.h * (long)local_1a8.w +
                    0xf & 0xfffffffffffffff0) / local_1a8.elemsize;
        local_e0 = local_1a8.dims;
        iStack_dc = local_1a8.w;
        iStack_d8 = local_1a8.h;
        iStack_d4 = local_1a8.d;
        pLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar29];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        pAStack_68 = opt->workspace_allocator;
        uStack_60._0_4_ = opt->openmp_blocktime;
        uStack_60._4_1_ = opt->use_winograd_convolution;
        uStack_60._5_1_ = opt->use_sgemm_convolution;
        uStack_60._6_1_ = opt->use_int8_inference;
        uStack_60._7_1_ = opt->use_vulkan_compute;
        uStack_58._0_1_ = opt->use_bf16_storage;
        uStack_58._1_1_ = opt->use_fp16_packed;
        uStack_58._2_1_ = opt->use_fp16_storage;
        uStack_58._3_1_ = opt->use_fp16_arithmetic;
        uStack_58._4_1_ = opt->use_int8_packed;
        uStack_58._5_1_ = opt->use_int8_storage;
        uStack_58._6_1_ = opt->use_int8_arithmetic;
        uStack_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_reserved_0;
        uStack_48._0_4_ = opt->flush_denormals;
        uStack_48._4_1_ = opt->use_local_pool_allocator;
        uStack_48._5_1_ = opt->use_shader_local_memory;
        uStack_48._6_1_ = opt->use_cooperative_matrix;
        uStack_48._7_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_reserved_6;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = local_1a8.allocator;
        local_d0 = (int)uVar21 / (int)uVar27;
        local_88 = (int)uVar31 / iVar16;
        (*pLVar4->_vptr_Layer[7])(pLVar4,&local_c0,&local_108,&local_78);
        if (local_100 != (int *)0x0) {
          LOCK();
          *local_100 = *local_100 + -1;
          UNLOCK();
          if (*local_100 == 0) {
            if (local_e8 == (Allocator *)0x0) {
              if (local_108 != (void *)0x0) {
                free(local_108);
              }
            }
            else {
              (*local_e8->_vptr_Allocator[3])();
            }
          }
        }
        if (local_b8 != (int *)0x0) {
          LOCK();
          *local_b8 = *local_b8 + -1;
          UNLOCK();
          if (*local_b8 == 0) {
            if (local_a0 == (Allocator *)0x0) {
              if (local_c0 != (_func_int ***)0x0) {
                free(local_c0);
              }
            }
            else {
              (*local_a0->_vptr_Allocator[3])();
            }
          }
        }
        lVar29 = lVar29 + 1;
        iVar15 = iVar15 + (int)uVar21;
        iVar32 = iVar32 + (int)uVar31;
      } while (lVar29 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
    }
    if (uVar27 < _elempack) {
      iVar17 = 0;
      convert_packing(&local_1a8,top_blob,_elempack,opt);
    }
    else {
      iVar17 = 0;
      if (&local_1a8 != top_blob) {
        if (local_1a8.refcount != (int *)0x0) {
          LOCK();
          *local_1a8.refcount = *local_1a8.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_1a8.data;
        top_blob->refcount = local_1a8.refcount;
        top_blob->elemsize = local_1a8.elemsize;
        top_blob->elempack = local_1a8.elempack;
        top_blob->allocator = local_1a8.allocator;
        top_blob->dims = local_1a8.dims;
        top_blob->w = local_1a8.w;
        top_blob->h = local_1a8.h;
        top_blob->d = local_1a8.d;
        top_blob->c = local_1a8.c;
        top_blob->cstep = local_1a8.cstep;
      }
    }
  }
  if (local_1a8.refcount != (int *)0x0) {
    LOCK();
    *local_1a8.refcount = *local_1a8.refcount + -1;
    UNLOCK();
    if (*local_1a8.refcount == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_158.refcount != (int *)0x0) {
    LOCK();
    *local_158.refcount = *local_158.refcount + -1;
    UNLOCK();
    if (*local_158.refcount == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_158.data != (Allocator *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00417a02:
  piVar2 = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1f8.data != (Allocator *)0x0) {
          free(local_1f8.data);
        }
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}